

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

void __thiscall RtApiAlsa::probeDevices(RtApiAlsa *this)

{
  ostringstream *poVar1;
  string *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> *this_02;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *__args;
  pointer ppVar2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar3;
  uint uVar4;
  int iVar5;
  __type _Var6;
  bool bVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ostream *poVar13;
  char *pcVar14;
  iterator __position;
  const_iterator __position_00;
  ulong uVar15;
  pointer ppVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *dID;
  iterator __begin2;
  char *__s;
  void *__s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  undefined8 uStack_200;
  char local_1f8 [8];
  char name [128];
  string local_170;
  undefined1 local_150 [8];
  string prettyName;
  string id;
  undefined1 local_108 [8];
  string defaultDeviceName;
  DeviceInfo info;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  deviceID_prettyName;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2;
  snd_ctl_t *handle;
  int device;
  int card;
  
  __range2 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)0x0;
  uStack_200 = 0x179ba6;
  lVar9 = snd_ctl_card_info_sizeof();
  lVar9 = -(lVar9 + 0xfU & 0xfffffffffffffff0);
  __s = local_1f8 + lVar9;
  *(undefined8 *)((long)&uStack_200 + lVar9) = 0x179bbc;
  sVar10 = snd_ctl_card_info_sizeof();
  *(undefined8 *)((long)&uStack_200 + lVar9) = 0x179bcd;
  memset(__s,0,sVar10);
  *(undefined8 *)((long)&uStack_200 + lVar9) = 0x179bd2;
  lVar9 = snd_pcm_info_sizeof();
  __s_00 = __s + -(lVar9 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)__s_00 + -8) = 0x179be8;
  sVar10 = snd_pcm_info_sizeof();
  *(undefined8 *)((long)__s_00 + -8) = 0x179bf5;
  memset(__s_00,0,sVar10);
  info.nativeFormats = 0;
  local_108 = (undefined1  [8])&defaultDeviceName._M_string_length;
  defaultDeviceName._M_dataplus._M_p = (pointer)0x0;
  defaultDeviceName._M_string_length._0_1_ = 0;
  *(undefined8 *)((long)__s_00 + -8) = 0x179c25;
  iVar8 = snd_ctl_open(&__range2,"default",0);
  if (iVar8 == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x179c43;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[20],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&defaultDeviceName.field_2 + 8),(char (*) [8])"default",
               (char (*) [20])"Default ALSA Device");
    *(undefined8 *)((long)__s_00 + -8) = 0x179c53;
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&info.nativeFormats,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&defaultDeviceName.field_2 + 8));
    *(undefined8 *)((long)__s_00 + -8) = 0x179c5f;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&defaultDeviceName.field_2 + 8));
    *(undefined8 *)((long)__s_00 + -8) = 0x179c73;
    std::__cxx11::string::_M_assign((string *)local_108);
    pvVar3 = __range2;
    *(undefined8 *)((long)__s_00 + -8) = 0x179c7c;
    snd_ctl_close(pvVar3);
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x179c8e;
  iVar8 = snd_ctl_open(&__range2,"pulse",0);
  if (iVar8 == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x179cac;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[6],_const_char_(&)[24],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&defaultDeviceName.field_2 + 8),(char (*) [6])"pulse",
               (char (*) [24])"PulseAudio Sound Server");
    *(undefined8 *)((long)__s_00 + -8) = 0x179cbc;
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&info.nativeFormats,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&defaultDeviceName.field_2 + 8));
    *(undefined8 *)((long)__s_00 + -8) = 0x179cc8;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&defaultDeviceName.field_2 + 8));
    pvVar3 = __range2;
    *(undefined8 *)((long)__s_00 + -8) = 0x179cd1;
    snd_ctl_close(pvVar3);
  }
  handle._4_4_ = -1;
  *(undefined8 *)((long)__s_00 + -8) = 0x179cdd;
  snd_card_next();
  poVar1 = &(this->super_RtApi).errorStream_;
  this_00 = &(this->super_RtApi).errorText_;
  this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(&defaultDeviceName.field_2._M_allocated_capacity + 1);
  while (-1 < handle._4_4_) {
    *(undefined8 *)((long)__s_00 + -8) = 0x179d26;
    sprintf(local_1f8,"hw:%d");
    *(undefined8 *)((long)__s_00 + -8) = 0x179d34;
    iVar8 = snd_ctl_open(&__range2,local_1f8,0);
    pvVar3 = __range2;
    if (iVar8 < 0) {
      __range2 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)0x0;
      *(undefined8 *)((long)__s_00 + -8) = 0x179f5d;
      poVar13 = std::operator<<((ostream *)poVar1,"RtApiAlsa::probeDevices: control open, card = ");
      iVar5 = handle._4_4_;
      *(undefined8 *)((long)__s_00 + -8) = 0x179f68;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar5);
      *(undefined8 *)((long)__s_00 + -8) = 0x179f77;
      poVar13 = std::operator<<(poVar13,", ");
      *(undefined8 *)((long)__s_00 + -8) = 0x179f81;
      pcVar14 = (char *)snd_strerror(iVar8);
      *(undefined8 *)((long)__s_00 + -8) = 0x179f8c;
      poVar13 = std::operator<<(poVar13,pcVar14);
      *(undefined8 *)((long)__s_00 + -8) = 0x179f9b;
      std::operator<<(poVar13,".");
      *(undefined8 *)((long)__s_00 + -8) = 0x179fa7;
      std::__cxx11::stringbuf::str();
    }
    else {
      *(undefined8 *)((long)__s_00 + -8) = 0x179d4b;
      iVar8 = snd_ctl_card_info(pvVar3,__s);
      if (iVar8 < 0) {
        *(undefined8 *)((long)__s_00 + -8) = 0x179fbc;
        poVar13 = std::operator<<((ostream *)poVar1,"RtApiAlsa::probeDevices: control info, card = "
                                 );
        iVar5 = handle._4_4_;
        *(undefined8 *)((long)__s_00 + -8) = 0x179fc7;
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar5);
        *(undefined8 *)((long)__s_00 + -8) = 0x179fd6;
        poVar13 = std::operator<<(poVar13,", ");
        *(undefined8 *)((long)__s_00 + -8) = 0x179fe0;
        pcVar14 = (char *)snd_strerror(iVar8);
        *(undefined8 *)((long)__s_00 + -8) = 0x179feb;
        poVar13 = std::operator<<(poVar13,pcVar14);
        *(undefined8 *)((long)__s_00 + -8) = 0x179ffa;
        std::operator<<(poVar13,".");
        *(undefined8 *)((long)__s_00 + -8) = 0x17a006;
        std::__cxx11::stringbuf::str();
      }
      else {
        handle._0_4_ = 0xffffffff;
LAB_00179d59:
        pvVar3 = __range2;
        *(undefined8 *)((long)__s_00 + -8) = 0x179d66;
        iVar8 = snd_ctl_pcm_next_device(pvVar3,&handle);
        if (-1 < iVar8) {
          if (-1 < (int)(uint)handle) {
            *(undefined8 *)((long)__s_00 + -8) = 0x179d83;
            snd_pcm_info_set_device(__s_00);
            *(undefined8 *)((long)__s_00 + -8) = 0x179d8d;
            snd_pcm_info_set_subdevice(__s_00,0);
            *(undefined8 *)((long)__s_00 + -8) = 0x179d97;
            snd_pcm_info_set_stream(__s_00,0);
            pvVar3 = __range2;
            *(undefined8 *)((long)__s_00 + -8) = 0x179da3;
            iVar8 = snd_ctl_pcm_info(pvVar3,__s_00);
            if (iVar8 < 0) goto LAB_00179e85;
            goto LAB_00179dab;
          }
          goto LAB_0017a082;
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x17a018;
        poVar13 = std::operator<<((ostream *)poVar1,
                                  "RtApiAlsa::probeDevices: control next device, card = ");
        iVar5 = handle._4_4_;
        *(undefined8 *)((long)__s_00 + -8) = 0x17a023;
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar5);
        *(undefined8 *)((long)__s_00 + -8) = 0x17a032;
        poVar13 = std::operator<<(poVar13,", ");
        *(undefined8 *)((long)__s_00 + -8) = 0x17a03c;
        pcVar14 = (char *)snd_strerror(iVar8);
        *(undefined8 *)((long)__s_00 + -8) = 0x17a047;
        poVar13 = std::operator<<(poVar13,pcVar14);
        *(undefined8 *)((long)__s_00 + -8) = 0x17a056;
        std::operator<<(poVar13,".");
        *(undefined8 *)((long)__s_00 + -8) = 0x17a062;
        std::__cxx11::stringbuf::str();
      }
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x17a06e;
    std::__cxx11::string::operator=((string *)this_00,(string *)this_01);
    *(undefined8 *)((long)__s_00 + -8) = 0x17a076;
    std::__cxx11::string::~string((string *)this_01);
    *(undefined8 *)((long)__s_00 + -8) = 1;
    uVar11 = *(undefined8 *)((long)__s_00 + -8);
    *(undefined8 *)((long)__s_00 + -8) = 0x17a082;
    RtApi::error(&this->super_RtApi,(RtAudioErrorType)uVar11);
LAB_0017a082:
    if (__range2 !=
        (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)0x0) {
      *(undefined8 *)((long)__s_00 + -8) = 0x17a090;
      snd_ctl_close();
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x17a099;
    snd_card_next((long)&handle + 4);
  }
  if (info.nativeFormats == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x17a2d0;
    std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::clear
              (&(this->super_RtApi).deviceList_);
    *(undefined8 *)((long)__s_00 + -8) = 0x17a2df;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::clear(&this->deviceIdPairs_);
  }
  else {
    __position._M_current =
         (this->deviceIdPairs_).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
LAB_0017a0be:
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              info.nativeFormats;
    if (__position._M_current !=
        (this->deviceIdPairs_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (pbVar17 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          *(undefined8 *)((long)__s_00 + -8) = 0x17a0f8;
          __position = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::erase(&this->deviceIdPairs_,__position._M_current);
          goto LAB_0017a0be;
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x17a0df;
        _Var6 = std::operator==(pbVar17,&(__position._M_current)->first);
        pbVar17 = pbVar17 + 2;
      } while (!_Var6);
      __position._M_current = __position._M_current + 1;
      goto LAB_0017a0be;
    }
    this_02 = &(this->super_RtApi).deviceList_;
    for (; pbVar17 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pbVar17 = pbVar17 + 2) {
      ppVar16 = (this->deviceIdPairs_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->deviceIdPairs_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (ppVar16 == ppVar2) {
          defaultDeviceName.field_2._8_4_ = 0;
          info._0_8_ = &info.name._M_string_length;
          info.name._M_dataplus._M_p = (pointer)0x0;
          info.name._M_string_length._0_1_ = 0;
          info.outputChannels = 0;
          info.inputChannels._0_1_ = 0;
          info.inputChannels._1_1_ = 0;
          info.name.field_2._8_4_ = 0;
          info.name.field_2._12_2_ = 0;
          info.name.field_2._14_2_ = 0;
          info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          info.duplexChannels = 0;
          info.isDefaultOutput = false;
          info.isDefaultInput = false;
          info._54_2_ = 0;
          info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          info.currentSampleRate = 0;
          info.preferredSampleRate = 0;
          *(undefined8 *)((long)__s_00 + -8) = 0x17a195;
          std::__cxx11::string::_M_assign((string *)&info);
          *(undefined8 *)((long)__s_00 + -8) = 0x17a1a7;
          std::__cxx11::string::string((string *)&local_170,(string *)pbVar17);
          *(undefined8 *)((long)__s_00 + -8) = 0x17a1b9;
          bVar7 = probeDeviceInfo(this,(DeviceInfo *)((long)&defaultDeviceName.field_2 + 8),
                                  &local_170);
          *(undefined8 *)((long)__s_00 + -8) = 0x17a1c3;
          std::__cxx11::string::~string((string *)&local_170);
          if (bVar7) {
            defaultDeviceName.field_2._8_4_ = (this->super_RtApi).currentDeviceId_;
            (this->super_RtApi).currentDeviceId_ = defaultDeviceName.field_2._8_4_ + 1;
            *(undefined8 *)((long)__s_00 + -8) = 0x17a1f5;
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&info,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_108);
            if (_Var6) {
              if (info.name.field_2._8_4_ != 0) {
                info.inputChannels._0_1_ = 1;
              }
              if (CONCAT22(info.name.field_2._14_2_,info.name.field_2._12_2_) != 0) {
                info.inputChannels._1_1_ = 1;
              }
            }
            *(undefined8 *)((long)__s_00 + -8) = 0x17a229;
            std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::push_back
                      (this_02,(value_type *)((long)&defaultDeviceName.field_2 + 8));
            __args = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                      *)(prettyName.field_2._M_local_buf + 8);
            *(undefined8 *)((long)__s_00 + -8) = 0x17a23b;
            std::__cxx11::string::string((string *)__args,(string *)pbVar17);
            *(undefined8 *)((long)__s_00 + -8) = 0x17a253;
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)&this->deviceIdPairs_,__args);
            *(undefined8 *)((long)__s_00 + -8) = 0x17a25b;
            std::__cxx11::string::~string((string *)__args);
          }
          *(undefined8 *)((long)__s_00 + -8) = 0x17a267;
          RtAudio::DeviceInfo::~DeviceInfo((DeviceInfo *)((long)&defaultDeviceName.field_2 + 8));
          break;
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x17a13a;
        _Var6 = std::operator==(pbVar17,&ppVar16->first);
        ppVar16 = ppVar16 + 1;
      } while (!_Var6);
    }
    __position_00._M_current =
         (this->super_RtApi).deviceList_.
         super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
         super__Vector_impl_data._M_start;
LAB_0017a27f:
    if (__position_00._M_current !=
        (this->super_RtApi).deviceList_.
        super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppVar2 = (this->deviceIdPairs_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar16 = (this->deviceIdPairs_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar2;
          ppVar16 = ppVar16 + 1) {
        if ((__position_00._M_current)->ID == ppVar16->second) {
          if (ppVar16 != ppVar2) {
            __position_00._M_current = __position_00._M_current + 1;
            goto LAB_0017a27f;
          }
          break;
        }
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x17a2be;
      __position_00._M_current =
           (DeviceInfo *)
           std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::erase
                     (this_02,__position_00);
      goto LAB_0017a27f;
    }
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x17a2eb;
  std::__cxx11::string::~string((string *)local_108);
  *(undefined8 *)((long)__s_00 + -8) = 0x17a2f4;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&info.nativeFormats);
  return;
LAB_00179e85:
  if (iVar8 == -2) {
    *(undefined8 *)((long)__s_00 + -8) = 1;
    uVar11 = *(undefined8 *)((long)__s_00 + -8);
    *(undefined8 *)((long)__s_00 + -8) = 0x179e99;
    snd_pcm_info_set_stream(__s_00,uVar11);
    pvVar3 = __range2;
    *(undefined8 *)((long)__s_00 + -8) = 0x179ea5;
    iVar8 = snd_ctl_pcm_info(pvVar3,__s_00);
    if (iVar8 < 0) {
      *(undefined8 *)((long)__s_00 + -8) = 0x179ebf;
      poVar13 = std::operator<<((ostream *)poVar1,
                                "RtApiAlsa::probeDevices: control pcm info, card = ");
      iVar5 = handle._4_4_;
      *(undefined8 *)((long)__s_00 + -8) = 0x179eca;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar5);
      *(undefined8 *)((long)__s_00 + -8) = 0x179ed9;
      poVar13 = std::operator<<(poVar13,", device = ");
      uVar4 = (uint)handle;
      *(undefined8 *)((long)__s_00 + -8) = 0x179ee4;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar4);
      *(undefined8 *)((long)__s_00 + -8) = 0x179ef3;
      poVar13 = std::operator<<(poVar13,", ");
      *(undefined8 *)((long)__s_00 + -8) = 0x179efd;
      pcVar14 = (char *)snd_strerror(iVar8);
      *(undefined8 *)((long)__s_00 + -8) = 0x179f08;
      poVar13 = std::operator<<(poVar13,pcVar14);
      *(undefined8 *)((long)__s_00 + -8) = 0x179f17;
      std::operator<<(poVar13,".");
      *(undefined8 *)((long)__s_00 + -8) = 0x179f23;
      std::__cxx11::stringbuf::str();
      *(undefined8 *)((long)__s_00 + -8) = 0x179f2f;
      std::__cxx11::string::operator=((string *)this_00,(string *)this_01);
      *(undefined8 *)((long)__s_00 + -8) = 0x179f37;
      std::__cxx11::string::~string((string *)this_01);
      *(undefined8 *)((long)__s_00 + -8) = 1;
      uVar11 = *(undefined8 *)((long)__s_00 + -8);
      *(undefined8 *)((long)__s_00 + -8) = 0x179f43;
      RtApi::error(&this->super_RtApi,(RtAudioErrorType)uVar11);
    }
    else {
LAB_00179dab:
      *(undefined8 *)((long)__s_00 + -8) = 0x179db4;
      uVar11 = snd_ctl_card_info_get_id(__s);
      uVar15 = (ulong)(uint)handle;
      *(undefined8 *)((long)__s_00 + -8) = 0x179dcb;
      sprintf(local_1f8,"hw:%s,%d",uVar11,uVar15);
      *(undefined8 *)((long)__s_00 + -8) = 0x179ddd;
      std::__cxx11::string::string
                ((string *)(prettyName.field_2._M_local_buf + 8),local_1f8,(allocator *)this_01);
      *(undefined8 *)((long)__s_00 + -8) = 0x179de6;
      uVar11 = snd_ctl_card_info_get_name(__s);
      *(undefined8 *)((long)__s_00 + -8) = 0x179df1;
      uVar12 = snd_pcm_info_get_id(__s_00);
      *(undefined8 *)((long)__s_00 + -8) = 0x179e08;
      sprintf(local_1f8,"%s (%s)",uVar11,uVar12);
      *(undefined8 *)((long)__s_00 + -8) = 0x179e1d;
      std::__cxx11::string::string((string *)local_150,local_1f8,(allocator *)this_01);
      *(undefined8 *)((long)__s_00 + -8) = 0x179e2f;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&prettyName.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
      *(undefined8 *)((long)__s_00 + -8) = 0x179e3b;
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&info.nativeFormats,this_01);
      *(undefined8 *)((long)__s_00 + -8) = 0x179e43;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(this_01);
      if (((handle._4_4_ == 0) && ((uint)handle == 0)) &&
         (defaultDeviceName._M_dataplus._M_p == (pointer)0x0)) {
        *(undefined8 *)((long)__s_00 + -8) = 0x179e68;
        std::__cxx11::string::assign(local_108);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x179e74;
      std::__cxx11::string::~string((string *)local_150);
      *(undefined8 *)((long)__s_00 + -8) = 0x179e80;
      std::__cxx11::string::~string((string *)(prettyName.field_2._M_local_buf + 8));
    }
  }
  goto LAB_00179d59;
}

Assistant:

void RtApiAlsa :: probeDevices( void )
{
  // See list of required functionality in RtApi::probeDevices().
  
  int result, device, card;
  char name[128];
  snd_ctl_t *handle = 0;
  snd_ctl_card_info_t *ctlinfo;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&ctlinfo);
  snd_pcm_info_alloca(&pcminfo);
  // First element isthe device hw ID, second is the device "pretty name"
  std::vector<std::pair<std::string, std::string>> deviceID_prettyName;
  snd_pcm_stream_t stream;
  std::string defaultDeviceName;

  // Add the default interface if available.
  result = snd_ctl_open( &handle, "default", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"default", "Default ALSA Device"});
    defaultDeviceName = deviceID_prettyName[0].second;
    snd_ctl_close( handle );
  }

  // Add the Pulse interface if available.
  result = snd_ctl_open( &handle, "pulse", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"pulse",  "PulseAudio Sound Server"});
    snd_ctl_close( handle );
  }
  
  // Count cards and devices and get ascii identifiers.
  card = -1;
  snd_card_next( &card );
  while ( card >= 0 ) {
    sprintf( name, "hw:%d", card );
    result = snd_ctl_open( &handle, name, 0 );
    if ( result < 0 ) {
      handle = 0;
      errorStream_ << "RtApiAlsa::probeDevices: control open, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    result = snd_ctl_card_info( handle, ctlinfo );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::probeDevices: control info, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    device = -1;
    while( 1 ) {
      result = snd_ctl_pcm_next_device( handle, &device );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::probeDevices: control next device, card = " << card << ", " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        error( RTAUDIO_WARNING );
        break;
      }
      if ( device < 0 )
        break;

      snd_pcm_info_set_device( pcminfo, device );
      snd_pcm_info_set_subdevice( pcminfo, 0 );
      stream = SND_PCM_STREAM_PLAYBACK;
      snd_pcm_info_set_stream( pcminfo, stream );
      result = snd_ctl_pcm_info( handle, pcminfo );
      if ( result < 0 ) {
        if ( result == -ENOENT ) { // try as input stream
          stream = SND_PCM_STREAM_CAPTURE;
          snd_pcm_info_set_stream( pcminfo, stream );
          result = snd_ctl_pcm_info( handle, pcminfo );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::probeDevices: control pcm info, card = " << card << ", device = " << device << ", " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
            error( RTAUDIO_WARNING );
            continue;
          }
        }
        else continue;
      }
      sprintf( name, "hw:%s,%d", snd_ctl_card_info_get_id(ctlinfo), device );
      std::string id(name);
      sprintf( name, "%s (%s)", snd_ctl_card_info_get_name(ctlinfo), snd_pcm_info_get_id(pcminfo) );
      std::string prettyName(name);
      deviceID_prettyName.push_back( {id, prettyName} );
      if ( card == 0 && device == 0 && defaultDeviceName.empty() )
        defaultDeviceName = name;
    }
  nextcard:
    if ( handle )
      snd_ctl_close( handle );
    snd_card_next( &card );
  }

  if ( deviceID_prettyName.size() == 0 ) {
    deviceList_.clear();
    deviceIdPairs_.clear();
    return;
  }

  // Clean removed devices
  for ( auto it = deviceIdPairs_.begin(); it != deviceIdPairs_.end(); ) {
    bool found = false;
    for ( auto& d: deviceID_prettyName ) {
      if ( d.first == (*it).first ) {
        found = true;
        break;
      }
    }

    if ( found )
      ++it;
    else
      it = deviceIdPairs_.erase(it);
  }

  // Fill or update the deviceList_ and also save a corresponding list of Ids.
  for ( auto& d : deviceID_prettyName ) {
    bool found = false;
    for ( auto& dID : deviceIdPairs_ ) {
      if ( d.first == dID.first ) {
        found = true;
        break; // We already have this device.
      }
    }

    if ( found )
      continue;

    // new device
    RtAudio::DeviceInfo info;
    info.name = d.second;
    if ( probeDeviceInfo( info, d.first ) == false ) continue; // ignore if probe fails
    info.ID = currentDeviceId_++;  // arbitrary internal device ID
    if ( info.name == defaultDeviceName ) {
      if ( info.outputChannels > 0 ) info.isDefaultOutput = true;
      if ( info.inputChannels > 0 ) info.isDefaultInput = true;
    }
    deviceList_.push_back( info );
    deviceIdPairs_.push_back({d.first, info.ID});
    // I don't see that ALSA provides property listeners to know if
    // devices are removed or added.
  }

  // Remove any devices left in the list that are no longer available.
  for ( std::vector<RtAudio::DeviceInfo>::iterator it=deviceList_.begin(); it!=deviceList_.end(); )
  {
    auto itID = deviceIdPairs_.begin();
    while ( itID != deviceIdPairs_.end() ) {
      if ( (*it).ID == (*itID).second ) {
        break;
      }
      ++itID;
    }

    if ( itID == deviceIdPairs_.end() ) {
      // not found so remove it from our list
      it = deviceList_.erase( it );
    }
    else
      ++it;
  }
}